

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testKeepAlives(StringRef *addrString)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  C *pCVar4;
  C *pCVar5;
  socklen_t __len;
  undefined8 uVar6;
  uint *puVar7;
  sockaddr *__addr;
  SockAddr addr;
  bool result;
  Socket socket;
  dword_t delay;
  dword_t value;
  StringRef *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  Socket *in_stack_ffffffffffffff10;
  bool local_ca;
  undefined1 local_68 [28];
  undefined4 local_4c;
  bool local_25;
  Socket local_14;
  uint local_10 [4];
  
  local_10[1] = 1;
  local_10[0] = 3;
  axl::io::Socket::Socket((Socket *)0x10e272);
  printf("Opening a TCP socket (%d sec keep-alives)...\n",(ulong)local_10[0]);
  uVar6 = 0;
  uVar3 = axl::io::Socket::open(&local_14,(char *)0x2,1,6);
  __len = (socklen_t)CONCAT71((int7)((ulong)uVar6 >> 8),(char)uVar3);
  local_ca = false;
  if ((uVar3 & 1) != 0) {
    puVar7 = local_10 + 1;
    bVar1 = axl::io::Socket::setOption
                      (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                       (int)in_stack_ffffffffffffff08,
                       (void *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       (size_t)in_stack_fffffffffffffef8);
    __len = (socklen_t)CONCAT71((int7)((ulong)puVar7 >> 8),bVar1);
    local_ca = false;
    if (bVar1) {
      puVar7 = local_10;
      bVar1 = axl::io::Socket::setOption
                        (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (int)in_stack_ffffffffffffff08,
                         (void *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         (size_t)in_stack_fffffffffffffef8);
      __len = (socklen_t)CONCAT71((int7)((ulong)puVar7 >> 8),bVar1);
      local_ca = false;
      if (bVar1) {
        __len = (socklen_t)local_10;
        local_ca = axl::io::Socket::setOption
                             (in_stack_ffffffffffffff10,
                              (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                              (int)in_stack_ffffffffffffff08,
                              (void *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                              (size_t)in_stack_fffffffffffffef8);
      }
    }
  }
  local_25 = local_ca;
  if (local_ca == false) {
    axl::err::getLastErrorDescription();
    pCVar4 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    printf("socket.open failed (%s)\n",pCVar4);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10e3cc);
  }
  else {
    pCVar5 = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    printf("Parsing address \'%s\'...\n",pCVar5);
    axl::io::SockAddr::SockAddr((SockAddr *)0x10e451);
    local_25 = axl::io::SockAddr::parse
                         ((SockAddr *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8);
    if (local_25) {
      axl::io::SockAddr::getString((SockAddr *)in_stack_fffffffffffffef8);
      pCVar4 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      printf("Connecting to %s...\n",pCVar4);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10e544);
      uVar3 = axl::io::Socket::connect(&local_14,(int)local_68,__addr,__len);
      bVar2 = (byte)uVar3;
      local_25 = (bool)(bVar2 & 1);
      if ((uVar3 & 1) != 0) {
        printf("Press CTRL+C to exit...\n");
        do {
          axl::sys::sleep(1000);
        } while( true );
      }
      axl::err::getLastErrorDescription();
      pCVar4 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          CONCAT17(bVar2,in_stack_ffffffffffffff00));
      printf("socket.connect failed (%s)\n",pCVar4);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10e5b4);
    }
    else {
      axl::err::getLastErrorDescription();
      pCVar4 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      printf("addr.parse failed (%s)\n",pCVar4);
      axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10e4ca);
    }
  }
  local_4c = 1;
  axl::io::Socket::~Socket((Socket *)0x10e62e);
  return;
}

Assistant:

void
testKeepAlives(const sl::StringRef& addrString) {
	dword_t value = 1;
	dword_t delay = 3;

	io::Socket socket;

	printf("Opening a TCP socket (%d sec keep-alives)...\n", delay);

	bool result =
		socket.open(AF_INET, SOCK_STREAM, IPPROTO_TCP) &&
		socket.setOption(SOL_SOCKET, SO_KEEPALIVE, &value, sizeof(value)) &&
		socket.setOption(IPPROTO_TCP, TCP_KEEPIDLE, &delay, sizeof(delay)) &&
		socket.setOption(IPPROTO_TCP, TCP_KEEPINTVL, &delay, sizeof(delay));

	if (!result) {
		printf("socket.open failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Parsing address '%s'...\n", addrString.sz());

	io::SockAddr addr;
	result = addr.parse(addrString);
	if (!result) {
		printf("addr.parse failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Connecting to %s...\n", addr.getString().sz());

	result = socket.connect(addr);
	if (!result) {
		printf("socket.connect failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Press CTRL+C to exit...\n");

	for (;;) {
		sys::sleep(1000);
	}
}